

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::moveSamplesToNewBuffer
          (TypedDeepImageChannel<Imath_3_2::half> *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  half *phVar1;
  Vec2<int> VVar2;
  half *phVar3;
  size_t sVar4;
  half *phVar5;
  ulong uVar6;
  ulong uVar7;
  half **pphVar8;
  size_t i;
  ulong uVar9;
  half *phVar10;
  ulong uVar11;
  
  phVar1 = this->_sampleBuffer;
  VVar2 = (this->super_DeepImageChannel).super_ImageChannel._level[4]._dataWindow.min;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (long)VVar2) {
    uVar9 = (long)VVar2 * 2;
  }
  phVar5 = (half *)operator_new__(uVar9);
  this->_sampleBuffer = phVar5;
  for (uVar9 = 0; uVar9 < (this->super_DeepImageChannel).super_ImageChannel._numPixels;
      uVar9 = uVar9 + 1) {
    pphVar8 = this->_sampleListPointers;
    phVar10 = this->_sampleBuffer;
    phVar3 = pphVar8[uVar9];
    sVar4 = newSampleListPositions[uVar9];
    phVar5 = phVar10 + sVar4;
    uVar11 = (ulong)oldNumSamples[uVar9];
    uVar6 = (ulong)newNumSamples[uVar9];
    if (newNumSamples[uVar9] < oldNumSamples[uVar9]) {
      for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
        phVar5[uVar11]._h = phVar3[uVar11]._h;
      }
    }
    else {
      for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
        phVar5[uVar7]._h = phVar3[uVar7]._h;
      }
      phVar10 = phVar10 + sVar4 + uVar11;
      for (; uVar11 < uVar6; uVar11 = uVar11 + 1) {
        Imath_3_2::half::operator=(phVar10,0.0);
        uVar6 = (ulong)newNumSamples[uVar9];
        phVar10 = phVar10 + 1;
      }
      pphVar8 = this->_sampleListPointers;
    }
    pphVar8[uVar9] = phVar5;
  }
  if (phVar1 != (half *)0x0) {
    operator_delete__(phVar1);
    return;
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSamplesToNewBuffer (
    const unsigned int* oldNumSamples,
    const unsigned int* newNumSamples,
    const size_t*       newSampleListPositions)
{
    //
    // Allocate a new sample buffer for this channel.
    // Copy the sample lists for all pixels into the new buffer.
    // Then delete the old sample buffer.
    //
    // oldNumSamples            Number of samples in each sample list in the
    //                          old sample buffer.
    //
    // newNumSamples            Number of samples in each sample list in
    //                          the new sample buffer.  If the new number
    //                          of samples is larger than the old number of
    //                          samples for a given sample list, then the
    //                          end of the new sample list is filled with
    //                          zeroes.  If the new number of samples is
    //                          smaller than the old one, then samples at
    //                          the end of the old sample list are discarded.
    //
    // newSampleListPositions   The positions of the new sample lists in the
    //                          new sample buffer.
    //

    T* oldSampleBuffer = _sampleBuffer;
    _sampleBuffer      = new T[sampleCounts ().sampleBufferSize ()];

    for (size_t i = 0; i < numPixels (); ++i)
    {
        T* oldSampleList = _sampleListPointers[i];
        T* newSampleList = _sampleBuffer + newSampleListPositions[i];

        if (oldNumSamples[i] > newNumSamples[i])
        {
            for (unsigned int j = 0; j < newNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];
        }
        else
        {
            for (unsigned int j = 0; j < oldNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];

            for (unsigned int j = oldNumSamples[i]; j < newNumSamples[i]; ++j)
                newSampleList[j] = 0;
        }

        _sampleListPointers[i] = newSampleList;
    }

    delete[] oldSampleBuffer;
}